

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O1

void transaction_tests::CreateCreditAndSpend
               (FillableSigningProvider *keystore,CScript *outscript,CTransactionRef *output,
               CMutableTransaction *input,bool success)

{
  CScript *pCVar1;
  element_type *peVar2;
  CTxIn *pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__first1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__last1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__first2;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint256 *puVar9;
  base_blob<256U> *pbVar10;
  _Base_ptr p_Var11;
  bool bVar12;
  long in_FS_OFFSET;
  DataStream ssin;
  CMutableTransaction inputm;
  DataStream ssout;
  CMutableTransaction outputm;
  SignatureData empty;
  DataStream local_498;
  CMutableTransaction local_470;
  DataStream local_438;
  CMutableTransaction local_410;
  ParamsStream<DataStream_&,_TransactionSerParams> local_3d8;
  SignatureData local_3c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&local_410);
  local_410.version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&local_410.vin,1);
  pCVar5 = local_410.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar10 = &((local_410.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
  (pbVar10->m_data)._M_elems[0x10] = '\0';
  (pbVar10->m_data)._M_elems[0x11] = '\0';
  (pbVar10->m_data)._M_elems[0x12] = '\0';
  (pbVar10->m_data)._M_elems[0x13] = '\0';
  (pbVar10->m_data)._M_elems[0x14] = '\0';
  (pbVar10->m_data)._M_elems[0x15] = '\0';
  (pbVar10->m_data)._M_elems[0x16] = '\0';
  (pbVar10->m_data)._M_elems[0x17] = '\0';
  pbVar10 = &((local_410.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
  (pbVar10->m_data)._M_elems[0x18] = '\0';
  (pbVar10->m_data)._M_elems[0x19] = '\0';
  (pbVar10->m_data)._M_elems[0x1a] = '\0';
  (pbVar10->m_data)._M_elems[0x1b] = '\0';
  (pbVar10->m_data)._M_elems[0x1c] = '\0';
  (pbVar10->m_data)._M_elems[0x1d] = '\0';
  (pbVar10->m_data)._M_elems[0x1e] = '\0';
  (pbVar10->m_data)._M_elems[0x1f] = '\0';
  puVar9 = &((local_410.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped;
  (puVar9->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar9->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar9->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar9->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar9->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar9->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar9->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar9->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar10 = &((local_410.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
  (pbVar10->m_data)._M_elems[8] = '\0';
  (pbVar10->m_data)._M_elems[9] = '\0';
  (pbVar10->m_data)._M_elems[10] = '\0';
  (pbVar10->m_data)._M_elems[0xb] = '\0';
  (pbVar10->m_data)._M_elems[0xc] = '\0';
  (pbVar10->m_data)._M_elems[0xd] = '\0';
  (pbVar10->m_data)._M_elems[0xe] = '\0';
  (pbVar10->m_data)._M_elems[0xf] = '\0';
  ((local_410.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0xffffffff;
  pCVar1 = &(local_410.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->scriptSig;
  if (0x1c < ((local_410.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._size) {
    free((pCVar1->super_CScriptBase)._union.indirect_contents.indirect);
  }
  *(undefined8 *)((long)&(pCVar5->scriptSig).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(pCVar5->scriptSig).super_CScriptBase._union + 0x18) = 0;
  (pCVar1->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(pCVar5->scriptSig).super_CScriptBase._union + 8) = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_410.vout,1);
  (local_410.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 1;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((local_410.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &outscript->super_CScriptBase);
  local_438.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438.m_read_pos = 0;
  local_438.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8._0_8_ = &::TX_WITH_WITNESS;
  local_3c8.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)&local_438;
  SerializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CMutableTransaction>
            (&local_410,(ParamsStream<DataStream_&,_TransactionSerParams> *)&local_3c8,
             &::TX_WITH_WITNESS);
  local_3c8._0_8_ = &::TX_WITH_WITNESS;
  local_3c8.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)&local_438;
  Unserialize<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>
            ((ParamsStream<DataStream_&,_TransactionSerParams> *)&local_3c8,output);
  peVar2 = (output->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar3 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pCVar3 != 0x68) {
    __assert_fail("output->vin.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1d0,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  bVar12 = ::operator==(pCVar3,local_410.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start);
  if (!bVar12) {
    __assert_fail("output->vin[0] == outputm.vin[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1d1,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  peVar2 = (output->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar4 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pCVar4 != 0x28) {
    __assert_fail("output->vout.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1d2,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  if (pCVar4->nValue ==
      (local_410.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_start)->nValue) {
    bVar12 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                       (&(pCVar4->scriptPubKey).super_CScriptBase,
                        &((local_410.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                           _M_impl.super__Vector_impl_data._M_start)->scriptPubKey).
                         super_CScriptBase);
    if (bVar12) {
      CMutableTransaction::CMutableTransaction(&local_470);
      local_470.version = 1;
      std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&local_470.vin,1);
      peVar2 = (output->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar6 = *(undefined8 *)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar7 = *(undefined8 *)
               ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar8 = *(undefined8 *)
               ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      *(undefined8 *)
       (((local_470.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 0x10) =
           *(undefined8 *)
            ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      *(undefined8 *)
       (((local_470.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 0x18) = uVar8;
      *(undefined8 *)
       ((local_470.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
       _M_elems = uVar6;
      *(undefined8 *)
       (((local_470.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 8) = uVar7;
      ((local_470.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).n = 0;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_470.vout,1);
      pCVar4 = local_470.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      (local_470.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_start)->nValue = 1;
      pCVar1 = &(local_470.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptPubKey;
      if (0x1c < ((local_470.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size) {
        free((pCVar1->super_CScriptBase)._union.indirect_contents.indirect);
      }
      *(undefined8 *)((long)&(pCVar4->scriptPubKey).super_CScriptBase._union + 0x10) = 0;
      *(undefined8 *)((long)&(pCVar4->scriptPubKey).super_CScriptBase._union + 0x18) = 0;
      (pCVar1->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
      *(undefined8 *)((long)&(pCVar4->scriptPubKey).super_CScriptBase._union + 8) = 0;
      local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffff0000;
      p_Var11 = &local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      memset((direct_or_indirect *)&local_3c8.scriptSig,0,0xb8);
      local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
      super__Optional_payload<TaprootBuilder,_true,_false,_false>.
      super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
      local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.taproot_key_path_sig.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3c8.taproot_key_path_sig.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3c8.taproot_key_path_sig.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_3c8.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
      local_3c8.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3c8.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3c8.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3c8.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var11;
      local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var11
      ;
      local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar12 = SignSignature(&keystore->super_SigningProvider,
                             (output->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr,&local_470,0,1,&local_3c8);
      if (bVar12 != success) {
        __assert_fail("ret == success",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                      ,0x1df,
                      "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                     );
      }
      local_498.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_498.m_read_pos = 0;
      local_498.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_498.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3d8.m_params = &::TX_WITH_WITNESS;
      local_3d8.m_substream = &local_498;
      SerializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CMutableTransaction>
                (&local_470,&local_3d8,&::TX_WITH_WITNESS);
      local_3d8.m_params = &::TX_WITH_WITNESS;
      local_3d8.m_substream = &local_498;
      UnserializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CMutableTransaction>
                (input,&local_3d8,&::TX_WITH_WITNESS);
      pCVar3 = (input->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(input->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pCVar3 != 0x68) {
        __assert_fail("input.vin.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                      ,0x1e3,
                      "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                     );
      }
      bVar12 = ::operator==(pCVar3,local_470.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
      if (bVar12) {
        pCVar4 = (input->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)(input->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pCVar4 != 0x28) {
          __assert_fail("input.vout.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                        ,0x1e5,
                        "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                       );
        }
        if (pCVar4->nValue ==
            (local_470.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start)->nValue) {
          bVar12 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                             (&(pCVar4->scriptPubKey).super_CScriptBase,
                              &((local_470.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->scriptPubKey).
                               super_CScriptBase);
          if (bVar12) {
            pCVar5 = (input->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start;
            __first1 = *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)
                        &(pCVar5->scriptWitness).stack.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ;
            __last1 = *(pointer *)((long)&(pCVar5->scriptWitness).stack + 8);
            __first2 = ((local_470.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start)->scriptWitness).stack.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            if ((long)__last1 - (long)__first1 ==
                (long)((local_470.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->scriptWitness).stack.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) {
              bVar12 = std::__equal<false>::
                       equal<std::vector<unsigned_char,std::allocator<unsigned_char>>const*,std::vector<unsigned_char,std::allocator<unsigned_char>>const*>
                                 (__first1,__last1,__first2);
              if (bVar12) {
                std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                          ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                           &local_498);
                SignatureData::~SignatureData(&local_3c8);
                std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_470.vout);
                std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_470.vin);
                std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                          ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                           &local_438);
                std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_410.vout);
                std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_410.vin);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  return;
                }
                __stack_chk_fail();
              }
            }
            __assert_fail("input.vin[0].scriptWitness.stack == inputm.vin[0].scriptWitness.stack",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                          ,0x1e7,
                          "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                         );
          }
        }
        __assert_fail("input.vout[0] == inputm.vout[0]",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                      ,0x1e6,
                      "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                     );
      }
      __assert_fail("input.vin[0] == inputm.vin[0]",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                    ,0x1e4,
                    "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                   );
    }
  }
  __assert_fail("output->vout[0] == outputm.vout[0]",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ,0x1d3,
                "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
               );
}

Assistant:

static void CreateCreditAndSpend(const FillableSigningProvider& keystore, const CScript& outscript, CTransactionRef& output, CMutableTransaction& input, bool success = true)
{
    CMutableTransaction outputm;
    outputm.version = 1;
    outputm.vin.resize(1);
    outputm.vin[0].prevout.SetNull();
    outputm.vin[0].scriptSig = CScript();
    outputm.vout.resize(1);
    outputm.vout[0].nValue = 1;
    outputm.vout[0].scriptPubKey = outscript;
    DataStream ssout;
    ssout << TX_WITH_WITNESS(outputm);
    ssout >> TX_WITH_WITNESS(output);
    assert(output->vin.size() == 1);
    assert(output->vin[0] == outputm.vin[0]);
    assert(output->vout.size() == 1);
    assert(output->vout[0] == outputm.vout[0]);

    CMutableTransaction inputm;
    inputm.version = 1;
    inputm.vin.resize(1);
    inputm.vin[0].prevout.hash = output->GetHash();
    inputm.vin[0].prevout.n = 0;
    inputm.vout.resize(1);
    inputm.vout[0].nValue = 1;
    inputm.vout[0].scriptPubKey = CScript();
    SignatureData empty;
    bool ret = SignSignature(keystore, *output, inputm, 0, SIGHASH_ALL, empty);
    assert(ret == success);
    DataStream ssin;
    ssin << TX_WITH_WITNESS(inputm);
    ssin >> TX_WITH_WITNESS(input);
    assert(input.vin.size() == 1);
    assert(input.vin[0] == inputm.vin[0]);
    assert(input.vout.size() == 1);
    assert(input.vout[0] == inputm.vout[0]);
    assert(input.vin[0].scriptWitness.stack == inputm.vin[0].scriptWitness.stack);
}